

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O2

void bufchain_fetch(bufchain *ch,void *data,size_t len)

{
  size_t sVar1;
  size_t __n;
  
  if (ch->buffersize < len) {
    __assert_fail("ch->buffersize >= len",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                  ,0x87,"void bufchain_fetch(bufchain *, void *, size_t)");
  }
  while( true ) {
    if (len == 0) {
      return;
    }
    ch = (bufchain *)ch->head;
    if (ch == (bufchain *)0x0) break;
    sVar1 = (long)ch->buffersize - (long)ch->tail;
    if ((long)(int)len < (long)sVar1) {
      sVar1 = len;
    }
    __n = (size_t)(int)sVar1;
    memcpy(data,ch->tail,__n);
    len = len - __n;
    data = (void *)((long)data + __n);
  }
  __assert_fail("tmp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                ,0x8b,"void bufchain_fetch(bufchain *, void *, size_t)");
}

Assistant:

void bufchain_fetch(bufchain *ch, void *data, size_t len)
{
    struct bufchain_granule *tmp;
    char *data_c = (char *)data;

    tmp = ch->head;

    assert(ch->buffersize >= len);
    while (len > 0) {
        int remlen = len;

        assert(tmp != NULL);
        if (remlen >= tmp->bufend - tmp->bufpos)
            remlen = tmp->bufend - tmp->bufpos;
        memcpy(data_c, tmp->bufpos, remlen);

        tmp = tmp->next;
        len -= remlen;
        data_c += remlen;
    }
}